

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(ColumnChunk *a,ColumnChunk *b)

{
  _ColumnChunk__isset _Var1;
  int32_t iVar2;
  int64_t iVar3;
  
  std::__cxx11::string::swap((string *)&a->file_path);
  iVar3 = a->file_offset;
  a->file_offset = b->file_offset;
  b->file_offset = iVar3;
  swap(&a->meta_data,&b->meta_data);
  iVar3 = a->offset_index_offset;
  a->offset_index_offset = b->offset_index_offset;
  b->offset_index_offset = iVar3;
  iVar2 = a->offset_index_length;
  a->offset_index_length = b->offset_index_length;
  b->offset_index_length = iVar2;
  iVar3 = a->column_index_offset;
  a->column_index_offset = b->column_index_offset;
  b->column_index_offset = iVar3;
  iVar2 = a->column_index_length;
  a->column_index_length = b->column_index_length;
  b->column_index_length = iVar2;
  swap(&a->crypto_metadata,&b->crypto_metadata);
  std::__cxx11::string::swap((string *)&a->encrypted_column_metadata);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(ColumnChunk &a, ColumnChunk &b) {
  using ::std::swap;
  swap(a.file_path, b.file_path);
  swap(a.file_offset, b.file_offset);
  swap(a.meta_data, b.meta_data);
  swap(a.offset_index_offset, b.offset_index_offset);
  swap(a.offset_index_length, b.offset_index_length);
  swap(a.column_index_offset, b.column_index_offset);
  swap(a.column_index_length, b.column_index_length);
  swap(a.crypto_metadata, b.crypto_metadata);
  swap(a.encrypted_column_metadata, b.encrypted_column_metadata);
  swap(a.__isset, b.__isset);
}